

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.h
# Opt level: O2

void __thiscall cmXMLWriter::Attribute<long>(cmXMLWriter *this,char *name,long *value)

{
  ostream *poVar1;
  
  PreAttribute(this);
  poVar1 = std::operator<<(this->Output,name);
  poVar1 = std::operator<<(poVar1,"=\"");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1,'\"');
  return;
}

Assistant:

void Attribute(const char* name, T const& value)
  {
    this->PreAttribute();
    this->Output << name << "=\"" << SafeAttribute(value) << '"';
  }